

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cursor.c
# Opt level: O1

void command_callback(int key)

{
  uchar *puVar1;
  GLFWcursor *cursorHandle;
  int iVar2;
  char *__s;
  int iVar3;
  int iVar4;
  GLFWimage image;
  GLFWimage local_18;
  
  if (key < 0x44) {
    if (key < 0x33) {
      if (key == 0x31) {
        iVar3 = 0x34001;
      }
      else {
        if (key != 0x32) {
          return;
        }
        iVar3 = 0x34002;
      }
    }
    else {
      if (key != 0x33) {
        if (key != 0x43) {
          return;
        }
        if (cursor != (GLFWcursor *)0x0) {
          return;
        }
        local_18.width = cursorSize[(uint)currentSize].w;
        local_18.height = cursorSize[(uint)currentSize].h;
        local_18.pixels = (uchar *)malloc((long)(local_18.width * local_18.height * 4));
        if (0 < local_18.height) {
          iVar3 = 0;
          puVar1 = local_18.pixels;
          do {
            if (0 < local_18.width) {
              iVar2 = 0;
              iVar4 = 0;
              do {
                puVar1[0] = 0xff;
                puVar1[1] = '\0';
                puVar1[2] = (uchar)((iVar3 * 0xff) / local_18.height);
                puVar1[3] = (uchar)(iVar2 / local_18.width);
                puVar1 = puVar1 + 4;
                iVar4 = iVar4 + 1;
                iVar2 = iVar2 + 0xff;
              } while (iVar4 < local_18.width);
            }
            iVar3 = iVar3 + 1;
          } while (iVar3 < local_18.height);
        }
        cursor = glfwCreateCursor(&local_18,local_18.width / 2,local_18.height / 2);
        currentSize = currentSize + ((currentSize + 1U) / 5) * -5 + 1;
        free(local_18.pixels);
        return;
      }
      iVar3 = 0x34003;
    }
    glfwSetInputMode(activeWindow,0x33001,iVar3);
    return;
  }
  if (key < 0x4e) {
    if (key == 0x44) {
      if (cursor != (GLFWcursor *)0x0) {
        glfwDestroyCursor(cursor);
        cursor = (GLFWcursor *)0x0;
      }
    }
    else if (key == 0x48) {
      puts("H: show this help");
      puts("C: call glfwCreateCursor()");
      puts("D: call glfwDestroyCursor()");
      puts("S: call glfwSetCursor()");
      puts("N: call glfwSetCursor() with NULL");
      puts("1: set GLFW_CURSOR_NORMAL");
      puts("2: set GLFW_CURSOR_HIDDEN");
      puts("3: set GLFW_CURSOR_DISABLED");
      __s = "T: enable 3s delay for all previous commands";
LAB_0010717d:
      puts(__s);
      return;
    }
    return;
  }
  if (key == 0x4e) {
    cursorHandle = (GLFWcursor *)0x0;
  }
  else {
    if (key != 0x53) {
      return;
    }
    cursorHandle = cursor;
    if (cursor == (GLFWcursor *)0x0) {
      __s = "The cursor is not created";
      goto LAB_0010717d;
    }
  }
  glfwSetCursor(activeWindow,cursorHandle);
  return;
}

Assistant:

static void command_callback(int key)
{
    switch (key)
    {
        case GLFW_KEY_H:
        {
            printf("H: show this help\n");
            printf("C: call glfwCreateCursor()\n");
            printf("D: call glfwDestroyCursor()\n");
            printf("S: call glfwSetCursor()\n");
            printf("N: call glfwSetCursor() with NULL\n");
            printf("1: set GLFW_CURSOR_NORMAL\n");
            printf("2: set GLFW_CURSOR_HIDDEN\n");
            printf("3: set GLFW_CURSOR_DISABLED\n");
            printf("T: enable 3s delay for all previous commands\n");
        }
        break;

        case GLFW_KEY_C:
        {
            int x, y;
            GLFWimage image;
            unsigned char* pixels;

            if (cursor)
              break;

            image.width = cursorSize[currentSize].w;
            image.height = cursorSize[currentSize].h;

            pixels = malloc(4 * image.width * image.height);
            image.pixels = pixels;

            for (y = 0;  y < image.height;  y++)
            {
                for (x =  0;  x < image.width;  x++)
                {
                    *pixels++ = 0xff;
                    *pixels++ = 0;
                    *pixels++ = 255 * y / image.height;
                    *pixels++ = 255 * x / image.width;
                }
            }

            cursor = glfwCreateCursor(&image, image.width / 2, image.height / 2);
            currentSize = (currentSize + 1) % SizeCount;
            free(image.pixels);
            break;
        }

        case GLFW_KEY_D:
        {
            if (cursor != NULL)
            {
                glfwDestroyCursor(cursor);
                cursor = NULL;
            }

            break;
        }

        case GLFW_KEY_S:
        {
            if (cursor != NULL)
                glfwSetCursor(activeWindow, cursor);
            else
                printf("The cursor is not created\n");

            break;
        }

        case GLFW_KEY_N:
            glfwSetCursor(activeWindow, NULL);
            break;

        case GLFW_KEY_1:
            glfwSetInputMode(activeWindow, GLFW_CURSOR, GLFW_CURSOR_NORMAL);
            break;

        case GLFW_KEY_2:
            glfwSetInputMode(activeWindow, GLFW_CURSOR, GLFW_CURSOR_HIDDEN);
            break;

        case GLFW_KEY_3:
            glfwSetInputMode(activeWindow, GLFW_CURSOR, GLFW_CURSOR_DISABLED);
            break;
    }
}